

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O2

CSVFormat * csv::CSVFormat::guess_csv(void)

{
  CSVFormat *pCVar1;
  CSVFormat *in_RDI;
  initializer_list<char> __l;
  allocator_type local_31;
  char local_30 [8];
  _Vector_base<char,_std::allocator<char>_> local_28;
  
  CSVFormat(in_RDI);
  builtin_strncpy(local_30,",|\t;^",5);
  __l._M_len = 5;
  __l._M_array = local_30;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_28,__l,&local_31);
  pCVar1 = delimiter(in_RDI,(vector<char,_std::allocator<char>_> *)&local_28);
  pCVar1 = quote(pCVar1,'\"');
  header_row(pCVar1,0);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_28);
  return in_RDI;
}

Assistant:

CSV_INLINE static CSVFormat guess_csv() {
            CSVFormat format;
            format.delimiter({ ',', '|', '\t', ';', '^' })
                .quote('"')
                .header_row(0);

            return format;
        }